

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O2

_nhr_map_node * nhr_map_last(_nhr_map_node *map)

{
  _nhr_map_node *cur;
  _nhr_map_node *p_Var1;
  
  for (p_Var1 = map; p_Var1 != (_nhr_map_node *)0x0; p_Var1 = p_Var1->next) {
    map = p_Var1;
  }
  return map;
}

Assistant:

_nhr_map_node * nhr_map_last(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last = map;
	while (cur) {
		last = cur;
		cur = cur->next;
	}
	return last;
}